

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dispatchkit.hpp
# Opt level: O3

void __thiscall
chaiscript::detail::Dispatch_Engine::add_object(Dispatch_Engine *this,string *name,Boxed_Value *obj)

{
  _Map_base<void_*,_std::pair<void_*const,_chaiscript::detail::Stack_Holder>,_std::allocator<std::pair<void_*const,_chaiscript::detail::Stack_Holder>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *this_00;
  mapped_type *t_holder;
  Boxed_Value local_28;
  
  local_28.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (obj->m_data).
           super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_28.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi =
       (obj->m_data).super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi;
  (obj->m_data).super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (obj->m_data).super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  this_00 = (_Map_base<void_*,_std::pair<void_*const,_chaiscript::detail::Stack_Holder>,_std::allocator<std::pair<void_*const,_chaiscript::detail::Stack_Holder>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             *)threading::Thread_Storage<chaiscript::detail::Stack_Holder>::t();
  t_holder = std::__detail::
             _Map_base<void_*,_std::pair<void_*const,_chaiscript::detail::Stack_Holder>,_std::allocator<std::pair<void_*const,_chaiscript::detail::Stack_Holder>_>,_std::__detail::_Select1st,_std::equal_to<void_*>,_std::hash<void_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[](this_00,&(this->m_stack_holder).m_key);
  add_object(this,name,&local_28,t_holder);
  if (local_28.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_28.m_data.
               super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return;
}

Assistant:

void add_object(const std::string &name, Boxed_Value obj)
        {
          add_object(name, std::move(obj), get_stack_holder());
        }